

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_5.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  ostream *this_00;
  int local_3c;
  int local_38;
  int q;
  int p;
  int temp;
  int l;
  int k;
  int j_1;
  int i_1;
  int j;
  int i;
  int ans;
  int m;
  int n;
  
  m = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&ans);
  std::istream::operator>>(this,&i);
  j = -0x3ed;
  for (i_1 = 0; i_1 < ans; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < i; j_1 = j_1 + 1) {
      std::istream::operator>>((istream *)&std::cin,a[i_1] + j_1);
    }
  }
  for (k = 0; k < ans; k = k + 1) {
    for (l = k; l < ans; l = l + 1) {
      for (temp = 0; temp < i; temp = temp + 1) {
        for (p = temp; p < i; p = p + 1) {
          q = 0;
          for (local_38 = k; local_38 <= l; local_38 = local_38 + 1) {
            for (local_3c = temp; local_3c <= p; local_3c = local_3c + 1) {
              q = a[local_38][local_3c] + q;
            }
          }
          if (j < q) {
            j = q;
          }
        }
      }
    }
  }
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    int n,m,ans;                        //一共有n行，m列，ans用记录和的结果；
    cin >> n >> m;
    ans = -1005;                        //由于最后的结果可能
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j <m; ++j) {
            cin >> a[i][j];
        }
    }
    for(int i = 0; i < n; i++)                                          //以下四个for循环实在暴力遍历找出所有的子矩阵
    {
        for (int j = i;j < n; j++)
        {
            for (int k = 0; k < m; ++k)
            {
                for (int l = k; l < m; ++l)
                {
                    //把子矩阵中所有元素加起来，
                    int temp = 0;   //暂时储存运算结果，来和ans比较，避免零矩阵的情况
                    for (int p = i; p <= j; p++)                        //i代表的是子矩阵行的起点，j代表的是子矩阵行的终点
                    {
                        for(int q = k; q <= l; q++)                     //k代表的是子矩阵列的起点，j代表的是子矩阵列的终点
                        {
                          temp += a[p][q];
                        }
                    }
                    //如果temp比ans的值大，就把结果赋给ans，
                    if(temp > ans)
                        ans = temp;
                }
            }
        }
    }
    cout << ans << endl;
    return 0;

}